

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O1

void __thiscall
llvm::DWARFDebugNames::ValueIterator::searchFromStartOfCurrentIndex(ValueIterator *this)

{
  uint uVar1;
  void *pvVar2;
  bool bVar3;
  bool bVar4;
  NameIndex *pNVar5;
  Optional<unsigned_long> OVar6;
  
  pNVar5 = this->CurrentIndex;
  uVar1 = (pNVar5->Section->NameIndices).super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>.
          super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>.
          super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>.
          super_SmallVectorBase.Size;
  pvVar2 = (pNVar5->Section->NameIndices).super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>.
           super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>.
           super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>.
           super_SmallVectorBase.BeginX;
  do {
    bVar3 = pNVar5 != (NameIndex *)((ulong)uVar1 * 0x98 + (long)pvVar2);
    if (!bVar3) {
LAB_00d6378a:
      setEnd(this);
      return;
    }
    OVar6 = findEntryOffsetInCurrentIndex(this);
    if (((undefined1  [16])OVar6.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      this->DataOffset = (uint64_t)OVar6.Storage.field_0;
      bVar4 = getEntryAtCurrentOffset(this);
      if (bVar4) {
        if (bVar3) {
          return;
        }
        goto LAB_00d6378a;
      }
    }
    pNVar5 = this->CurrentIndex + 1;
    this->CurrentIndex = pNVar5;
  } while( true );
}

Assistant:

void DWARFDebugNames::ValueIterator::searchFromStartOfCurrentIndex() {
  for (const NameIndex *End = CurrentIndex->Section.NameIndices.end();
       CurrentIndex != End; ++CurrentIndex) {
    if (findInCurrentIndex())
      return;
  }
  setEnd();
}